

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar21;
  NodeRef *pNVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  byte bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  UVIdentity<4> mapUV;
  undefined8 local_1508;
  undefined8 uStack_1500;
  ulong local_14f0;
  ulong local_14e8;
  ulong local_14e0;
  ulong local_14d8;
  NodeRef *local_14d0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  UVIdentity<4> *local_1378;
  byte local_1370;
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [32];
  undefined1 local_12e8 [32];
  undefined1 local_12c8 [32];
  undefined1 local_12a8 [32];
  undefined1 local_1288 [32];
  RTCHitN local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  uint local_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  uint uStack_11e0;
  uint uStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar77 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar78 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar79 = ZEXT3264(auVar60);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar80 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar81 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 1.0000004)));
  auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar63 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar64 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar15 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  pNVar22 = stack + 1;
  do {
    local_14d0 = pNVar22;
    if (local_14d0 == stack) break;
    pNVar22 = local_14d0 + -1;
    sVar30 = local_14d0[-1].ptr;
    do {
      if ((sVar30 & 8) == 0) {
        uVar16 = sVar30 & 0xfffffffffffffff0;
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar70._4_4_ = uVar6;
        auVar70._0_4_ = uVar6;
        auVar70._8_4_ = uVar6;
        auVar70._12_4_ = uVar6;
        auVar70._16_4_ = uVar6;
        auVar70._20_4_ = uVar6;
        auVar70._24_4_ = uVar6;
        auVar70._28_4_ = uVar6;
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar19),auVar70,
                                  *(undefined1 (*) [32])(uVar16 + 0x40 + uVar19));
        auVar66 = vsubps_avx512vl(ZEXT1632(auVar49),auVar77._0_32_);
        auVar66 = vmulps_avx512vl(auVar80._0_32_,auVar66);
        auVar67 = vmaxps_avx512vl(auVar64,auVar66);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar25),auVar70,
                                  *(undefined1 (*) [32])(uVar16 + 0x40 + uVar25));
        auVar66 = vsubps_avx512vl(ZEXT1632(auVar49),auVar78._0_32_);
        auVar66 = vmulps_avx512vl(auVar81._0_32_,auVar66);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar27),auVar70,
                                  *(undefined1 (*) [32])(uVar16 + 0x40 + uVar27));
        auVar68 = vsubps_avx512vl(ZEXT1632(auVar49),auVar79._0_32_);
        auVar68 = vmulps_avx512vl(auVar60,auVar68);
        auVar66 = vmaxps_avx(auVar66,auVar68);
        auVar66 = vmaxps_avx(auVar67,auVar66);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar19 ^ 0x20)),auVar70,
                                  *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar19 ^ 0x20)));
        auVar67 = vsubps_avx512vl(ZEXT1632(auVar49),auVar77._0_32_);
        auVar67 = vmulps_avx512vl(auVar61,auVar67);
        auVar68 = vminps_avx512vl(auVar65,auVar67);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar25 ^ 0x20)),auVar70,
                                  *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar25 ^ 0x20)));
        auVar67 = vsubps_avx512vl(ZEXT1632(auVar49),auVar78._0_32_);
        auVar67 = vmulps_avx512vl(auVar62,auVar67);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar27 ^ 0x20)),auVar70,
                                  *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar27 ^ 0x20)));
        auVar69 = vsubps_avx512vl(ZEXT1632(auVar49),auVar79._0_32_);
        auVar69 = vmulps_avx512vl(auVar63,auVar69);
        auVar67 = vminps_avx(auVar67,auVar69);
        auVar67 = vminps_avx(auVar68,auVar67);
        if (((uint)sVar30 & 7) == 6) {
          uVar13 = vcmpps_avx512vl(auVar66,auVar67,2);
          uVar12 = vcmpps_avx512vl(auVar70,*(undefined1 (*) [32])(uVar16 + 0x1c0),0xd);
          uVar14 = vcmpps_avx512vl(auVar70,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
          bVar36 = (byte)uVar13 & (byte)uVar12 & (byte)uVar14;
        }
        else {
          uVar13 = vcmpps_avx512vl(auVar66,auVar67,2);
          bVar36 = (byte)uVar13;
        }
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar36);
      }
      if ((sVar30 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar32 = 4;
        }
        else {
          uVar29 = sVar30 & 0xfffffffffffffff0;
          lVar17 = 0;
          for (uVar16 = unaff_RBX; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar32 = 0;
          for (uVar16 = unaff_RBX - 1 & unaff_RBX; sVar30 = *(size_t *)(uVar29 + lVar17 * 8),
              uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
            pNVar22->ptr = sVar30;
            pNVar22 = pNVar22 + 1;
            lVar17 = 0;
            for (uVar21 = uVar16; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar17 = lVar17 + 1;
            }
          }
        }
      }
      else {
        uVar32 = 6;
      }
    } while (uVar32 == 0);
    if (uVar32 == 6) {
      uVar32 = 0;
      local_14f0 = (ulong)((uint)sVar30 & 0xf) - 8;
      bVar34 = local_14f0 != 0;
      if (bVar34) {
        uVar16 = sVar30 & 0xfffffffffffffff0;
        local_14e8 = 0;
        do {
          lVar20 = local_14e8 * 0x50;
          pSVar9 = context->scene;
          pGVar10 = (pSVar9->geometries).items[*(uint *)(uVar16 + 0x30 + lVar20)].ptr;
          fVar3 = (pGVar10->time_range).lower;
          fVar3 = pGVar10->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar3) / ((pGVar10->time_range).upper - fVar3))
          ;
          auVar49 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
          auVar49 = vminss_avx(auVar49,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
          auVar73 = vmaxss_avx(ZEXT816(0) << 0x20,auVar49);
          lVar18 = (long)(int)auVar73._0_4_ * 0x38;
          local_14e0 = (ulong)*(uint *)(uVar16 + 4 + lVar20);
          lVar17 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar18);
          lVar18 = *(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar18);
          auVar49 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar16 + lVar20) * 4);
          local_14d8 = (ulong)*(uint *)(uVar16 + 0x10 + lVar20);
          auVar58 = *(undefined1 (*) [16])(lVar17 + local_14d8 * 4);
          uVar23 = (ulong)*(uint *)(uVar16 + 0x20 + lVar20);
          auVar59 = *(undefined1 (*) [16])(lVar17 + uVar23 * 4);
          auVar38 = *(undefined1 (*) [16])(lVar17 + local_14e0 * 4);
          uVar24 = (ulong)*(uint *)(uVar16 + 0x14 + lVar20);
          auVar53 = *(undefined1 (*) [16])(lVar17 + uVar24 * 4);
          uVar26 = (ulong)*(uint *)(uVar16 + 0x24 + lVar20);
          auVar54 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
          uVar28 = (ulong)*(uint *)(uVar16 + 8 + lVar20);
          auVar39 = *(undefined1 (*) [16])(lVar17 + uVar28 * 4);
          uVar33 = (ulong)*(uint *)(uVar16 + 0x18 + lVar20);
          auVar41 = *(undefined1 (*) [16])(lVar17 + uVar33 * 4);
          uVar31 = (ulong)*(uint *)(uVar16 + 0x28 + lVar20);
          auVar52 = *(undefined1 (*) [16])(lVar17 + uVar31 * 4);
          uVar29 = (ulong)*(uint *)(uVar16 + 0xc + lVar20);
          auVar50 = *(undefined1 (*) [16])(lVar17 + uVar29 * 4);
          uVar37 = (ulong)*(uint *)(uVar16 + 0x1c + lVar20);
          auVar51 = *(undefined1 (*) [16])(lVar17 + uVar37 * 4);
          uVar21 = (ulong)*(uint *)(uVar16 + 0x2c + lVar20);
          auVar40 = *(undefined1 (*) [16])(lVar17 + uVar21 * 4);
          auVar42 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar16 + lVar20) * 4);
          auVar43 = *(undefined1 (*) [16])(lVar18 + local_14d8 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar18 + uVar23 * 4);
          auVar44 = *(undefined1 (*) [16])(lVar18 + local_14e0 * 4);
          auVar45 = *(undefined1 (*) [16])(lVar18 + uVar24 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar18 + uVar26 * 4);
          auVar48 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
          auVar55 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
          auVar56 = *(undefined1 (*) [16])(lVar18 + uVar31 * 4);
          auVar57 = *(undefined1 (*) [16])(lVar18 + uVar29 * 4);
          auVar71 = *(undefined1 (*) [16])(lVar18 + uVar37 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar18 + uVar21 * 4);
          puVar2 = (undefined8 *)(uVar16 + 0x30 + lVar20);
          local_13b8 = *puVar2;
          uStack_13b0 = puVar2[1];
          puVar2 = (undefined8 *)(uVar16 + 0x40 + lVar20);
          auVar74 = vunpcklps_avx(auVar49,auVar39);
          auVar49 = vunpckhps_avx(auVar49,auVar39);
          auVar39 = vunpcklps_avx(auVar38,auVar50);
          auVar38 = vunpckhps_avx(auVar38,auVar50);
          auVar50 = vunpcklps_avx(auVar49,auVar38);
          auVar75 = vunpcklps_avx(auVar74,auVar39);
          auVar49 = vunpckhps_avx(auVar74,auVar39);
          auVar39 = vunpcklps_avx(auVar58,auVar41);
          auVar58 = vunpckhps_avx(auVar58,auVar41);
          auVar41 = vunpcklps_avx(auVar53,auVar51);
          auVar38 = vunpckhps_avx(auVar53,auVar51);
          auVar53 = vunpcklps_avx(auVar58,auVar38);
          auVar51 = vunpcklps_avx(auVar39,auVar41);
          auVar58 = vunpckhps_avx(auVar39,auVar41);
          auVar39 = vunpcklps_avx(auVar59,auVar52);
          auVar59 = vunpckhps_avx(auVar59,auVar52);
          auVar41 = vunpcklps_avx(auVar54,auVar40);
          auVar38 = vunpckhps_avx(auVar54,auVar40);
          auVar54 = vunpcklps_avx(auVar59,auVar38);
          auVar52 = vunpcklps_avx(auVar39,auVar41);
          auVar59 = vunpckhps_avx(auVar39,auVar41);
          auVar38 = vunpcklps_avx512vl(auVar42,auVar48);
          auVar39 = vunpckhps_avx512vl(auVar42,auVar48);
          auVar40 = vunpcklps_avx512vl(auVar44,auVar57);
          auVar41 = vunpckhps_avx512vl(auVar44,auVar57);
          auVar39 = vunpcklps_avx(auVar39,auVar41);
          auVar41 = vunpcklps_avx(auVar38,auVar40);
          auVar38 = vunpckhps_avx(auVar38,auVar40);
          auVar40 = vunpcklps_avx512vl(auVar43,auVar55);
          auVar42 = vunpckhps_avx512vl(auVar43,auVar55);
          auVar43 = vunpcklps_avx512vl(auVar45,auVar71);
          auVar44 = vunpckhps_avx512vl(auVar45,auVar71);
          auVar42 = vunpcklps_avx512vl(auVar42,auVar44);
          auVar44 = vunpcklps_avx512vl(auVar40,auVar43);
          auVar43 = vunpckhps_avx512vl(auVar40,auVar43);
          auVar45 = vunpcklps_avx512vl(auVar46,auVar56);
          auVar40 = vunpckhps_avx512vl(auVar46,auVar56);
          auVar46 = vunpcklps_avx512vl(auVar47,auVar72);
          auVar47 = vunpckhps_avx512vl(auVar47,auVar72);
          auVar40 = vunpcklps_avx(auVar40,auVar47);
          auVar47 = vunpcklps_avx512vl(auVar45,auVar46);
          auVar46 = vunpckhps_avx512vl(auVar45,auVar46);
          auVar48 = ZEXT416((uint)(fVar3 - auVar73._0_4_));
          auVar45 = vbroadcastss_avx512vl(auVar48);
          auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),auVar48);
          auVar55._0_4_ = auVar48._0_4_;
          auVar55._4_4_ = auVar55._0_4_;
          auVar55._8_4_ = auVar55._0_4_;
          auVar55._12_4_ = auVar55._0_4_;
          auVar41 = vmulps_avx512vl(auVar45,auVar41);
          auVar48 = vmulps_avx512vl(auVar45,auVar38);
          auVar39 = vmulps_avx512vl(auVar45,auVar39);
          auVar38 = vfmadd231ps_fma(auVar41,auVar55,auVar75);
          auVar48 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar49);
          auVar39 = vfmadd231ps_fma(auVar39,auVar55,auVar50);
          auVar49 = vmulps_avx512vl(auVar45,auVar44);
          auVar50 = vmulps_avx512vl(auVar45,auVar43);
          auVar42 = vmulps_avx512vl(auVar45,auVar42);
          auVar41 = vfmadd231ps_fma(auVar49,auVar55,auVar51);
          auVar58 = vfmadd231ps_fma(auVar50,auVar55,auVar58);
          auVar50 = vfmadd231ps_avx512vl(auVar42,auVar55,auVar53);
          auVar49 = vmulps_avx512vl(auVar45,auVar47);
          auVar51 = vmulps_avx512vl(auVar45,auVar46);
          auVar40 = vmulps_avx512vl(auVar45,auVar40);
          auVar53 = vfmadd231ps_fma(auVar49,auVar55,auVar52);
          local_13c8 = *puVar2;
          uStack_13c0 = puVar2[1];
          auVar59 = vfmadd231ps_fma(auVar51,auVar55,auVar59);
          local_1378 = &mapUV;
          uVar6 = *(undefined4 *)(ray + k * 4);
          auVar43._4_4_ = uVar6;
          auVar43._0_4_ = uVar6;
          auVar43._8_4_ = uVar6;
          auVar43._12_4_ = uVar6;
          auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar73._4_4_ = uVar6;
          auVar73._0_4_ = uVar6;
          auVar73._8_4_ = uVar6;
          auVar73._12_4_ = uVar6;
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar74._4_4_ = uVar6;
          auVar74._0_4_ = uVar6;
          auVar74._8_4_ = uVar6;
          auVar74._12_4_ = uVar6;
          auVar54 = vfmadd231ps_fma(auVar40,auVar55,auVar54);
          fVar3 = *(float *)(ray + k * 4 + 0x60);
          auVar76._4_4_ = fVar3;
          auVar76._0_4_ = fVar3;
          auVar76._8_4_ = fVar3;
          auVar76._12_4_ = fVar3;
          auVar49 = vsubps_avx(auVar38,auVar43);
          auVar40 = vsubps_avx512vl(auVar48,auVar52);
          auVar39 = vsubps_avx512vl(auVar39,auVar51);
          auVar41 = vsubps_avx512vl(auVar41,auVar43);
          auVar42 = vsubps_avx512vl(auVar58,auVar52);
          auVar50 = vsubps_avx512vl(auVar50,auVar51);
          auVar58 = vsubps_avx(auVar53,auVar43);
          auVar53 = vsubps_avx512vl(auVar59,auVar52);
          auVar54 = vsubps_avx512vl(auVar54,auVar51);
          auVar59 = vsubps_avx(auVar58,auVar49);
          auVar52 = vsubps_avx512vl(auVar53,auVar40);
          auVar51 = vsubps_avx512vl(auVar54,auVar39);
          auVar43 = vsubps_avx512vl(auVar49,auVar41);
          auVar46 = vsubps_avx512vl(auVar40,auVar42);
          auVar44 = vsubps_avx512vl(auVar39,auVar50);
          auVar45 = vsubps_avx512vl(auVar41,auVar58);
          auVar47 = vsubps_avx512vl(auVar42,auVar53);
          auVar48 = vsubps_avx512vl(auVar50,auVar54);
          auVar57._0_4_ = auVar58._0_4_ + auVar49._0_4_;
          auVar57._4_4_ = auVar58._4_4_ + auVar49._4_4_;
          auVar57._8_4_ = auVar58._8_4_ + auVar49._8_4_;
          auVar57._12_4_ = auVar58._12_4_ + auVar49._12_4_;
          auVar38 = vaddps_avx512vl(auVar53,auVar40);
          auVar55 = vaddps_avx512vl(auVar54,auVar39);
          auVar56 = vmulps_avx512vl(auVar38,auVar51);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar52,auVar55);
          auVar55 = vmulps_avx512vl(auVar55,auVar59);
          auVar55 = vfmsub231ps_avx512vl(auVar55,auVar51,auVar57);
          auVar71._0_4_ = auVar52._0_4_ * auVar57._0_4_;
          auVar71._4_4_ = auVar52._4_4_ * auVar57._4_4_;
          auVar71._8_4_ = auVar52._8_4_ * auVar57._8_4_;
          auVar71._12_4_ = auVar52._12_4_ * auVar57._12_4_;
          auVar38 = vfmsub231ps_fma(auVar71,auVar59,auVar38);
          auVar72._0_4_ = fVar3 * auVar38._0_4_;
          auVar72._4_4_ = fVar3 * auVar38._4_4_;
          auVar72._8_4_ = fVar3 * auVar38._8_4_;
          auVar72._12_4_ = fVar3 * auVar38._12_4_;
          auVar38 = vfmadd231ps_avx512vl(auVar72,auVar74,auVar55);
          local_13a8 = vfmadd231ps_avx512vl(auVar38,auVar73,auVar56);
          auVar38 = vaddps_avx512vl(auVar49,auVar41);
          auVar55 = vaddps_avx512vl(auVar40,auVar42);
          auVar56 = vaddps_avx512vl(auVar39,auVar50);
          auVar57 = vmulps_avx512vl(auVar55,auVar44);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar46,auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar43);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar44,auVar38);
          auVar38 = vmulps_avx512vl(auVar38,auVar46);
          auVar38 = vfmsub231ps_avx512vl(auVar38,auVar43,auVar55);
          auVar75._0_4_ = auVar38._0_4_ * fVar3;
          auVar75._4_4_ = auVar38._4_4_ * fVar3;
          auVar75._8_4_ = auVar38._8_4_ * fVar3;
          auVar75._12_4_ = auVar38._12_4_ * fVar3;
          auVar38 = vfmadd231ps_avx512vl(auVar75,auVar74,auVar56);
          local_1398 = vfmadd231ps_avx512vl(auVar38,auVar73,auVar57);
          auVar58 = vaddps_avx512vl(auVar41,auVar58);
          auVar38 = vaddps_avx512vl(auVar42,auVar53);
          auVar53 = vaddps_avx512vl(auVar50,auVar54);
          auVar54 = vmulps_avx512vl(auVar38,auVar48);
          auVar54 = vfmsub231ps_avx512vl(auVar54,auVar47,auVar53);
          auVar53 = vmulps_avx512vl(auVar53,auVar45);
          auVar53 = vfmsub231ps_avx512vl(auVar53,auVar48,auVar58);
          auVar41._0_4_ = auVar58._0_4_ * auVar47._0_4_;
          auVar41._4_4_ = auVar58._4_4_ * auVar47._4_4_;
          auVar41._8_4_ = auVar58._8_4_ * auVar47._8_4_;
          auVar41._12_4_ = auVar58._12_4_ * auVar47._12_4_;
          auVar58 = vfmsub231ps_avx512vl(auVar41,auVar45,auVar38);
          auVar58 = vmulps_avx512vl(auVar58,auVar76);
          auVar58 = vfmadd231ps_avx512vl(auVar58,auVar74,auVar53);
          auVar54 = vfmadd231ps_avx512vl(auVar58,auVar73,auVar54);
          auVar50._0_4_ = local_1398._0_4_ + local_13a8._0_4_;
          auVar50._4_4_ = local_1398._4_4_ + local_13a8._4_4_;
          auVar50._8_4_ = local_1398._8_4_ + local_13a8._8_4_;
          auVar50._12_4_ = local_1398._12_4_ + local_13a8._12_4_;
          local_1388 = vaddps_avx512vl(auVar54,auVar50);
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar58 = vandps_avx512vl(local_1388,auVar58);
          auVar38._8_4_ = 0x34000000;
          auVar38._0_8_ = 0x3400000034000000;
          auVar38._12_4_ = 0x34000000;
          auVar38 = vmulps_avx512vl(auVar58,auVar38);
          auVar53 = vminps_avx512vl(local_13a8,local_1398);
          auVar41 = vminps_avx512vl(auVar53,auVar54);
          auVar53._8_4_ = 0x80000000;
          auVar53._0_8_ = 0x8000000080000000;
          auVar53._12_4_ = 0x80000000;
          auVar53 = vxorps_avx512vl(auVar38,auVar53);
          uVar13 = vcmpps_avx512vl(auVar41,auVar53,5);
          auVar53 = vmaxps_avx512vl(local_13a8,local_1398);
          auVar53 = vmaxps_avx512vl(auVar53,auVar54);
          uVar12 = vcmpps_avx512vl(auVar53,auVar38,2);
          local_1370 = ((byte)uVar13 | (byte)uVar12) & 0xf;
          if (local_1370 != 0) {
            auVar38 = vmulps_avx512vl(auVar46,auVar51);
            auVar53 = vmulps_avx512vl(auVar59,auVar44);
            auVar54 = vmulps_avx512vl(auVar43,auVar52);
            auVar41 = vmulps_avx512vl(auVar47,auVar44);
            auVar50 = vmulps_avx512vl(auVar43,auVar48);
            auVar42 = vmulps_avx512vl(auVar45,auVar46);
            auVar52 = vfmsub213ps_avx512vl(auVar52,auVar44,auVar38);
            auVar51 = vfmsub213ps_avx512vl(auVar51,auVar43,auVar53);
            auVar59 = vfmsub213ps_avx512vl(auVar59,auVar46,auVar54);
            auVar46 = vfmsub213ps_avx512vl(auVar48,auVar46,auVar41);
            auVar44 = vfmsub213ps_avx512vl(auVar45,auVar44,auVar50);
            auVar43 = vfmsub213ps_avx512vl(auVar47,auVar43,auVar42);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar38 = vandps_avx512vl(auVar38,auVar45);
            auVar41 = vandps_avx512vl(auVar41,auVar45);
            uVar29 = vcmpps_avx512vl(auVar38,auVar41,1);
            auVar38 = vandps_avx512vl(auVar53,auVar45);
            auVar53 = vandps_avx512vl(auVar50,auVar45);
            uVar21 = vcmpps_avx512vl(auVar38,auVar53,1);
            auVar38 = vandps_avx512vl(auVar54,auVar45);
            auVar53 = vandps_avx512vl(auVar42,auVar45);
            uVar37 = vcmpps_avx512vl(auVar38,auVar53,1);
            bVar35 = (bool)((byte)uVar29 & 1);
            local_1338._0_4_ = (uint)bVar35 * auVar52._0_4_ | (uint)!bVar35 * auVar46._0_4_;
            bVar35 = (bool)((byte)(uVar29 >> 1) & 1);
            local_1338._4_4_ = (uint)bVar35 * auVar52._4_4_ | (uint)!bVar35 * auVar46._4_4_;
            bVar35 = (bool)((byte)(uVar29 >> 2) & 1);
            local_1338._8_4_ = (uint)bVar35 * auVar52._8_4_ | (uint)!bVar35 * auVar46._8_4_;
            bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
            local_1338._12_4_ = (uint)bVar35 * auVar52._12_4_ | (uint)!bVar35 * auVar46._12_4_;
            bVar35 = (bool)((byte)uVar21 & 1);
            local_1328._0_4_ = (uint)bVar35 * auVar51._0_4_ | (uint)!bVar35 * auVar44._0_4_;
            bVar35 = (bool)((byte)(uVar21 >> 1) & 1);
            local_1328._4_4_ = (uint)bVar35 * auVar51._4_4_ | (uint)!bVar35 * auVar44._4_4_;
            bVar35 = (bool)((byte)(uVar21 >> 2) & 1);
            local_1328._8_4_ = (uint)bVar35 * auVar51._8_4_ | (uint)!bVar35 * auVar44._8_4_;
            bVar35 = (bool)((byte)(uVar21 >> 3) & 1);
            local_1328._12_4_ = (uint)bVar35 * auVar51._12_4_ | (uint)!bVar35 * auVar44._12_4_;
            bVar35 = (bool)((byte)uVar37 & 1);
            local_1318[0] = (float)((uint)bVar35 * auVar59._0_4_ | (uint)!bVar35 * auVar43._0_4_);
            bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
            local_1318[1] = (float)((uint)bVar35 * auVar59._4_4_ | (uint)!bVar35 * auVar43._4_4_);
            bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
            local_1318[2] = (float)((uint)bVar35 * auVar59._8_4_ | (uint)!bVar35 * auVar43._8_4_);
            bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
            local_1318[3] = (float)((uint)bVar35 * auVar59._12_4_ | (uint)!bVar35 * auVar43._12_4_);
            auVar42._0_4_ = fVar3 * local_1318[0];
            auVar42._4_4_ = fVar3 * local_1318[1];
            auVar42._8_4_ = fVar3 * local_1318[2];
            auVar42._12_4_ = fVar3 * local_1318[3];
            auVar59 = vfmadd213ps_fma(auVar74,local_1328,auVar42);
            auVar59 = vfmadd213ps_fma(auVar73,local_1338,auVar59);
            auVar52._0_4_ = auVar59._0_4_ + auVar59._0_4_;
            auVar52._4_4_ = auVar59._4_4_ + auVar59._4_4_;
            auVar52._8_4_ = auVar59._8_4_ + auVar59._8_4_;
            auVar52._12_4_ = auVar59._12_4_ + auVar59._12_4_;
            auVar51._0_4_ = auVar39._0_4_ * local_1318[0];
            auVar51._4_4_ = auVar39._4_4_ * local_1318[1];
            auVar51._8_4_ = auVar39._8_4_ * local_1318[2];
            auVar51._12_4_ = auVar39._12_4_ * local_1318[3];
            auVar59 = vfmadd213ps_fma(auVar40,local_1328,auVar51);
            auVar59 = vfmadd213ps_fma(auVar49,local_1338,auVar59);
            auVar38 = vrcp14ps_avx512vl(auVar52);
            auVar49._8_4_ = 0x3f800000;
            auVar49._0_8_ = &DAT_3f8000003f800000;
            auVar49._12_4_ = 0x3f800000;
            auVar49 = vfnmadd213ps_avx512vl(auVar38,auVar52,auVar49);
            auVar49 = vfmadd132ps_fma(auVar49,auVar38,auVar38);
            local_1348._0_4_ = (auVar59._0_4_ + auVar59._0_4_) * auVar49._0_4_;
            local_1348._4_4_ = (auVar59._4_4_ + auVar59._4_4_) * auVar49._4_4_;
            local_1348._8_4_ = (auVar59._8_4_ + auVar59._8_4_) * auVar49._8_4_;
            local_1348._12_4_ = (auVar59._12_4_ + auVar59._12_4_) * auVar49._12_4_;
            uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar59._4_4_ = uVar6;
            auVar59._0_4_ = uVar6;
            auVar59._8_4_ = uVar6;
            auVar59._12_4_ = uVar6;
            uVar13 = vcmpps_avx512vl(local_1348,auVar59,2);
            uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar54._4_4_ = uVar6;
            auVar54._0_4_ = uVar6;
            auVar54._8_4_ = uVar6;
            auVar54._12_4_ = uVar6;
            uVar12 = vcmpps_avx512vl(local_1348,auVar54,0xd);
            local_1370 = (byte)uVar13 & (byte)uVar12 & local_1370;
            if (local_1370 != 0) {
              uVar13 = vcmpps_avx512vl(auVar52,_DAT_01feba10,4);
              local_1370 = local_1370 & (byte)uVar13;
              if (local_1370 != 0) {
                auVar39._8_4_ = 0x219392ef;
                auVar39._0_8_ = 0x219392ef219392ef;
                auVar39._12_4_ = 0x219392ef;
                uVar29 = vcmpps_avx512vl(auVar58,auVar39,5);
                auVar58 = vrcp14ps_avx512vl(local_1388);
                auVar44._8_4_ = 0x3f800000;
                auVar44._0_8_ = &DAT_3f8000003f800000;
                auVar44._12_4_ = 0x3f800000;
                auVar49 = vfnmadd213ps_fma(local_1388,auVar58,auVar44);
                auVar49 = vfmadd132ps_avx512vl(auVar49,auVar58,auVar58);
                fVar3 = (float)((uint)((byte)uVar29 & 1) * auVar49._0_4_);
                fVar4 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar49._4_4_);
                fVar5 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar49._8_4_);
                fVar1 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar49._12_4_);
                auVar40._0_4_ = fVar3 * local_13a8._0_4_;
                auVar40._4_4_ = fVar4 * local_13a8._4_4_;
                auVar40._8_4_ = fVar5 * local_13a8._8_4_;
                auVar40._12_4_ = fVar1 * local_13a8._12_4_;
                local_1368 = vminps_avx(auVar40,auVar44);
                auVar46._0_4_ = fVar3 * local_1398._0_4_;
                auVar46._4_4_ = fVar4 * local_1398._4_4_;
                auVar46._8_4_ = fVar5 * local_1398._8_4_;
                auVar46._12_4_ = fVar1 * local_1398._12_4_;
                local_1358 = vminps_avx(auVar46,auVar44);
                uVar29 = (ulong)local_1370;
                do {
                  uVar21 = 0;
                  for (uVar37 = uVar29; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000
                      ) {
                    uVar21 = uVar21 + 1;
                  }
                  pGVar10 = (pSVar9->geometries).items[*(uint *)((long)&local_13b8 + uVar21 * 4)].
                            ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar29 = uVar29 ^ 1L << (uVar21 & 0x3f);
                    bVar35 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar35 = false;
                  }
                  else {
                    uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar37 = (ulong)(uint)((int)uVar21 * 4);
                    uVar7 = *(undefined4 *)(local_1368 + uVar37);
                    local_1238._4_4_ = uVar7;
                    local_1238._0_4_ = uVar7;
                    local_1238._8_4_ = uVar7;
                    local_1238._12_4_ = uVar7;
                    uVar7 = *(undefined4 *)(local_1358 + uVar37);
                    local_1228._4_4_ = uVar7;
                    local_1228._0_4_ = uVar7;
                    local_1228._8_4_ = uVar7;
                    local_1228._12_4_ = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1348 + uVar37);
                    args.context = context->user;
                    local_1208 = vpbroadcastd_avx512vl();
                    uVar7 = *(undefined4 *)((long)&local_13c8 + uVar37);
                    local_1218._4_4_ = uVar7;
                    local_1218._0_4_ = uVar7;
                    local_1218._8_4_ = uVar7;
                    local_1218._12_4_ = uVar7;
                    uVar7 = *(undefined4 *)(local_1338 + uVar37);
                    uVar8 = *(undefined4 *)(local_1328 + uVar37);
                    local_1258._4_4_ = uVar8;
                    local_1258._0_4_ = uVar8;
                    local_1258._8_4_ = uVar8;
                    local_1258._12_4_ = uVar8;
                    uVar8 = *(undefined4 *)((long)local_1318 + uVar37);
                    local_1248._4_4_ = uVar8;
                    local_1248._0_4_ = uVar8;
                    local_1248._8_4_ = uVar8;
                    local_1248._12_4_ = uVar8;
                    local_1268[0] = (RTCHitN)(char)uVar7;
                    local_1268[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
                    local_1268[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                    local_1268[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                    local_1268[4] = (RTCHitN)(char)uVar7;
                    local_1268[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
                    local_1268[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                    local_1268[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                    local_1268[8] = (RTCHitN)(char)uVar7;
                    local_1268[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
                    local_1268[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                    local_1268[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                    local_1268[0xc] = (RTCHitN)(char)uVar7;
                    local_1268[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
                    local_1268[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                    local_1268[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_1208),ZEXT1632(local_1208));
                    uStack_11f4 = (args.context)->instID[0];
                    local_11f8 = uStack_11f4;
                    uStack_11f0 = uStack_11f4;
                    uStack_11ec = uStack_11f4;
                    uStack_11e8 = (args.context)->instPrimID[0];
                    uStack_11e4 = uStack_11e8;
                    uStack_11e0 = uStack_11e8;
                    uStack_11dc = uStack_11e8;
                    local_1418 = auVar15._0_8_;
                    uStack_1410 = auVar15._8_8_;
                    local_1508 = local_1418;
                    uStack_1500 = uStack_1410;
                    args.valid = (int *)&local_1508;
                    args.geometryUserPtr = pGVar10->userPtr;
                    args.hit = local_1268;
                    args.N = 4;
                    local_1288 = auVar77._0_32_;
                    local_12a8 = auVar78._0_32_;
                    local_12c8 = auVar79._0_32_;
                    local_12e8 = auVar80._0_32_;
                    local_1308 = auVar81._0_32_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar10->occlusionFilterN)(&args);
                      auVar81 = ZEXT3264(local_1308);
                      auVar80 = ZEXT3264(local_12e8);
                      auVar79 = ZEXT3264(local_12c8);
                      auVar78 = ZEXT3264(local_12a8);
                      auVar77 = ZEXT3264(local_1288);
                    }
                    auVar45._8_8_ = uStack_1500;
                    auVar45._0_8_ = local_1508;
                    uVar37 = vptestmd_avx512vl(auVar45,auVar45);
                    if ((uVar37 & 0xf) == 0) {
                      bVar35 = true;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&args);
                        auVar81 = ZEXT3264(local_1308);
                        auVar80 = ZEXT3264(local_12e8);
                        auVar79 = ZEXT3264(local_12c8);
                        auVar78 = ZEXT3264(local_12a8);
                        auVar77 = ZEXT3264(local_1288);
                      }
                      auVar47._8_8_ = uStack_1500;
                      auVar47._0_8_ = local_1508;
                      uVar37 = vptestmd_avx512vl(auVar47,auVar47);
                      uVar37 = uVar37 & 0xf;
                      auVar49 = *(undefined1 (*) [16])(args.ray + 0x80);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar35 = (bool)((byte)uVar37 & 1);
                      auVar48._0_4_ = (uint)bVar35 * auVar58._0_4_ | (uint)!bVar35 * auVar49._0_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
                      auVar48._4_4_ = (uint)bVar35 * auVar58._4_4_ | (uint)!bVar35 * auVar49._4_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
                      auVar48._8_4_ = (uint)bVar35 * auVar58._8_4_ | (uint)!bVar35 * auVar49._8_4_;
                      bVar35 = SUB81(uVar37 >> 3,0);
                      auVar48._12_4_ =
                           (uint)bVar35 * auVar58._12_4_ | (uint)!bVar35 * auVar49._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
                      bVar35 = (byte)uVar37 == 0;
                    }
                    if (bVar35) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
                      uVar29 = uVar29 ^ 1L << (uVar21 & 0x3f);
                    }
                  }
                  if (!bVar35) {
                    if (bVar34) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar32 = 1;
                    }
                    goto LAB_00844822;
                  }
                } while (uVar29 != 0);
              }
            }
          }
          local_14e8 = local_14e8 + 1;
          bVar34 = local_14e8 < local_14f0;
        } while (local_14e8 != local_14f0);
      }
    }
LAB_00844822:
  } while ((uVar32 & 3) == 0);
  return local_14d0 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }